

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
libcellml::flattenUnitsImports
          (libcellml *this,ModelPtr *flatModel,UnitsPtr *units,size_t index,ComponentPtr *component)

{
  int __flags;
  ModelPtr MVar2;
  UnitsPtr importedUnits;
  ModelPtr importingModelCopy;
  ImportSourcePtr importSource;
  string local_80;
  undefined1 local_60 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  size_t sVar1;
  
  sVar1 = index;
  ImportedEntity::importSource
            ((ImportedEntity *)
             &((flatModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_enable_shared_from_this<libcellml::Model>);
  __flags = (int)sVar1;
  MVar2 = ImportSource::model((ImportSource *)&local_80);
  Model::clone((Model *)(local_60 + 0x10),(__fn *)local_80._M_dataplus._M_p,
               MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi,__flags,component);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
  }
  ImportedEntity::importReference_abi_cxx11_
            (&local_80,
             (ImportedEntity *)
             &((flatModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_enable_shared_from_this<libcellml::Model>);
  Model::units((Model *)local_60,(string *)local_60._16_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  NamedEntity::name_abi_cxx11_
            (&local_80,
             (NamedEntity *)
             (flatModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  NamedEntity::setName((NamedEntity *)local_60._0_8_,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  Model::replaceUnits(*(Model **)this,(size_t)units,(UnitsPtr *)local_60);
  retrieveUnitsDependencies
            ((ModelPtr *)this,(ModelPtr *)(local_60 + 0x10),(UnitsPtr *)local_60,
             (ComponentPtr *)index);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void flattenUnitsImports(const ModelPtr &flatModel, const UnitsPtr &units, size_t index, const ComponentPtr &component)
{
    auto importSource = units->importSource();
    auto importingModelCopy = importSource->model()->clone();
    auto importedUnits = importingModelCopy->units(units->importReference());
    importedUnits->setName(units->name());
    flatModel->replaceUnits(index, importedUnits);
    retrieveUnitsDependencies(flatModel, importingModelCopy, importedUnits, component);
}